

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_encoder.h
# Opt level: O2

void rc_bittree_reverse(lzma_range_encoder *rc,probability *probs,uint32_t bit_count,uint32_t symbol
                       )

{
  size_t sVar1;
  ulong uVar2;
  anon_enum_32 aVar3;
  
  sVar1 = rc->count;
  uVar2 = 1;
  do {
    aVar3 = symbol & RC_BIT_1;
    symbol = symbol >> 1;
    rc->symbols[sVar1] = aVar3;
    rc->probs[sVar1] = probs + uVar2;
    sVar1 = sVar1 + 1;
    uVar2 = (ulong)(aVar3 + (int)uVar2 * 2);
    bit_count = bit_count - 1;
  } while (bit_count != 0);
  rc->count = sVar1;
  return;
}

Assistant:

static inline void
rc_bittree_reverse(lzma_range_encoder *rc, probability *probs,
		uint32_t bit_count, uint32_t symbol)
{
	uint32_t model_index = 1;

	do {
		const uint32_t bit = symbol & 1;
		symbol >>= 1;
		rc_bit(rc, &probs[model_index], bit);
		model_index = (model_index << 1) + bit;
	} while (--bit_count != 0);
}